

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

size_t fast_union_uint16(uint16_t *set_1,size_t size_1,uint16_t *set_2,size_t size_2,
                        uint16_t *buffer)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong in_RCX;
  ulong in_RSI;
  size_t unaff_retaddr;
  uint16_t *in_stack_00000078;
  uint32_t in_stack_00000084;
  uint16_t *in_stack_00000088;
  uint32_t in_stack_00000094;
  uint16_t *in_stack_00000098;
  uint16_t *in_stack_fffffffffffffff8;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    if (in_RSI < in_RCX) {
      uVar3 = union_uint16(set_2,size_2,buffer,unaff_retaddr,in_stack_fffffffffffffff8);
    }
    else {
      uVar3 = union_uint16(set_2,size_2,buffer,unaff_retaddr,in_stack_fffffffffffffff8);
    }
  }
  else if (in_RSI < in_RCX) {
    uVar2 = union_vector16(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                           in_stack_00000078);
    uVar3 = (ulong)uVar2;
  }
  else {
    uVar2 = union_vector16(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                           in_stack_00000078);
    uVar3 = (ulong)uVar2;
  }
  return uVar3;
}

Assistant:

size_t fast_union_uint16(const uint16_t *set_1, size_t size_1,
                         const uint16_t *set_2, size_t size_2,
                         uint16_t *buffer) {
#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        // compute union with smallest array first
        if (size_1 < size_2) {
            return union_vector16(set_1, (uint32_t)size_1, set_2,
                                  (uint32_t)size_2, buffer);
        } else {
            return union_vector16(set_2, (uint32_t)size_2, set_1,
                                  (uint32_t)size_1, buffer);
        }
    } else {
        // compute union with smallest array first
        if (size_1 < size_2) {
            return union_uint16(set_1, size_1, set_2, size_2, buffer);
        } else {
            return union_uint16(set_2, size_2, set_1, size_1, buffer);
        }
    }
#else
    // compute union with smallest array first
    if (size_1 < size_2) {
        return union_uint16(set_1, size_1, set_2, size_2, buffer);
    } else {
        return union_uint16(set_2, size_2, set_1, size_1, buffer);
    }
#endif
}